

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  uint uVar1;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar2;
  double *pdVar3;
  bool bVar4;
  uint ssize;
  ulong uVar5;
  int i;
  ulong uVar6;
  value_type vVar7;
  
  pFVar2 = (fadexpr->fadexpr_).left_;
  uVar1 = (((pFVar2->fadexpr_).left_)->dx_).num_elts;
  ssize = (((pFVar2->fadexpr_).right_)->dx_).num_elts;
  if ((int)ssize < (int)uVar1) {
    ssize = uVar1;
  }
  if (ssize != (this->dx_).num_elts) {
    Vector<double>::resize(&this->dx_,ssize);
  }
  if (ssize != 0) {
    pdVar3 = (this->dx_).ptr_to_data;
    bVar4 = FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>::
            hasFastAccess(&fadexpr->fadexpr_);
    uVar5 = 0;
    if (0 < (int)ssize) {
      uVar5 = (ulong)ssize;
    }
    uVar6 = 0;
    if (bVar4) {
      for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        vVar7 = FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>::
                fastAccessDx(&fadexpr->fadexpr_,(int)uVar6);
        pdVar3[uVar6] = vVar7;
      }
    }
    else {
      for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        vVar7 = FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>::dx
                          (&fadexpr->fadexpr_,(int)uVar6);
        pdVar3[uVar6] = vVar7;
      }
    }
  }
  vVar7 = FadBinaryDiv<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>::val
                    (&fadexpr->fadexpr_);
  this->val_ = vVar7;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}